

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

bool __thiscall pbrt::SampledSpectrum::HasNaNs(SampledSpectrum *this)

{
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar1;
  array<float,_4> *in_RDI;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (3 < local_14) {
      return false;
    }
    pstd::array<float,_4>::operator[](in_RDI,(long)local_14);
    eVar1 = IsNaN<float>(0.0);
    if (eVar1) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

PBRT_CPU_GPU
    bool HasNaNs() const {
        for (int i = 0; i < NSpectrumSamples; ++i)
            if (IsNaN(values[i]))
                return true;
        return false;
    }